

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

string * __thiscall Assimp::FIBoolValueImpl::toString_abi_cxx11_(FIBoolValueImpl *this)

{
  uint *puVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  _Bvector_impl *p_Var4;
  _Bit_const_iterator __first;
  anon_class_16_2_7fa2732d __f;
  _Bit_const_iterator __last;
  int n;
  ostringstream os;
  int local_1ac;
  long *local_1a8 [2];
  long local_198 [2];
  long local_188 [3];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  if (this->strValueValid == false) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    puVar1 = (uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18));
    *puVar1 = *puVar1 | 1;
    local_1ac = 0;
    p_Var4 = &(this->super_FIBoolValue).value.super__Bvector_base<std::allocator<bool>_>._M_impl;
    uVar2 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
    uVar3 = (p_Var4->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
    __last.super__Bit_iterator_base._M_offset = uVar3;
    __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
    __first.super__Bit_iterator_base._8_8_ = 0;
    __first.super__Bit_iterator_base._M_p =
         (this->super_FIBoolValue).value.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    __f.os = (ostringstream *)local_188;
    __f.n = &local_1ac;
    __last.super__Bit_iterator_base._12_4_ = 0;
    std::
    for_each<std::_Bit_const_iterator,Assimp::FIBoolValueImpl::toString[abi:cxx11]()const::_lambda(bool)_1_>
              (__first,__last,__f);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->strValue,(string *)local_1a8);
    if (local_1a8[0] != local_198) {
      operator_delete(local_1a8[0],local_198[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    std::ios_base::~ios_base(local_118);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            os << std::boolalpha;
            int n = 0;
            std::for_each(value.begin(), value.end(), [&](bool b) { if (++n > 1) os << ' '; os << b; });
            strValue = os.str();
        }
        return strValue;
    }